

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O0

shared_ptr<pstack::Dwarf::DIE::Raw> __thiscall
pstack::Dwarf::DIE::decode(DIE *this,Unit *unit,DIE *parent,Off offset)

{
  undefined8 off_;
  bool bVar1;
  unsigned_long end_;
  Off OVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstack::Dwarf::DIE::Raw> sVar4;
  uintmax_t local_78;
  size_t abbrev;
  undefined1 local_60 [24];
  DWARFReader r;
  Off offset_local;
  DIE *parent_local;
  Unit *unit_local;
  
  r._32_8_ = offset;
  parent_local = (DIE *)unit;
  unit_local = (Unit *)this;
  Elf::Section::io((Section *)local_60);
  off_ = r._32_8_;
  end_ = std::numeric_limits<unsigned_long>::max();
  DWARFReader::DWARFReader((DWARFReader *)(local_60 + 0x10),(csptr *)local_60,off_,end_);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)local_60);
  local_78 = DWARFReader::getuleb128((DWARFReader *)(local_60 + 0x10));
  if (local_78 == 0) {
    bVar1 = operator_cast_to_bool(parent);
    if (bVar1) {
      OVar2 = DWARFReader::getOffset((DWARFReader *)(local_60 + 0x10));
      peVar3 = std::
               __shared_ptr_access<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&parent->raw);
      peVar3->nextSibling = OVar2;
    }
    std::shared_ptr<pstack::Dwarf::DIE::Raw>::shared_ptr
              ((shared_ptr<pstack::Dwarf::DIE::Raw> *)this,(nullptr_t)0x0);
  }
  else {
    getOffset(parent);
    std::
    make_shared<pstack::Dwarf::DIE::Raw,pstack::Dwarf::Unit*&,pstack::Dwarf::DWARFReader&,unsigned_long&,unsigned_long>
              ((Unit **)this,(DWARFReader *)&parent_local,(unsigned_long *)(local_60 + 0x10),
               &local_78);
  }
  DWARFReader::~DWARFReader((DWARFReader *)(local_60 + 0x10));
  sVar4.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Dwarf::DIE::Raw>)
         sVar4.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DIE::Raw>
DIE::decode(Unit *unit, const DIE &parent, Elf::Off offset)
{
    DWARFReader r(unit->dwarf->debugInfo.io(), offset);
    size_t abbrev = r.getuleb128();
    if (abbrev == 0) {
        // If we get to the terminator, then we now know the parent's nextSibling:
        // update it now.
        if (parent)
            parent.raw->nextSibling = r.getOffset();
        return nullptr;
    }
    return std::make_shared<DIE::Raw>(unit, r, abbrev, parent.getOffset());
}